

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O0

void __thiscall hrvo::Simulator::Simulator(Simulator *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Simulator *in_stack_ffffffffffffffe8;
  KdTree *in_stack_fffffffffffffff0;
  
  *in_RDI = 0;
  pvVar1 = operator_new(0x38);
  KdTree::KdTree(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  in_RDI[1] = pvVar1;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::vector
            ((vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *)0x10d3c5);
  std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>::vector
            ((vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_> *)0x10d3d3);
  return;
}

Assistant:

Simulator::Simulator()
    : defaults_(NULL),
      kdTree_(new KdTree(this)),
      globalTime_(0.0F),
      timeStep_(0.0F),
      reachedGoals_(false) {}